

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildingOptionalObjects
          (SwiftGenerator *this,string *var,string *body_front)

{
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *body_front_local;
  string *var_local;
  SwiftGenerator *this_local;
  
  local_20 = body_front;
  body_front_local = var;
  var_local = (string *)this;
  std::operator+(&local_60,"let __",var);
  std::operator+(&local_40,&local_60,": Offset");
  CodeWriter::operator+=(&this->code_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator+(&local_b0,"if let s = obj.",body_front_local);
  std::operator+(&local_90,&local_b0," {");
  CodeWriter::operator+=(&this->code_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  Indent(this);
  std::operator+(&local_110,"__",body_front_local);
  std::operator+(&local_f0,&local_110," = ");
  std::operator+(&local_d0,&local_f0,local_20);
  CodeWriter::operator+=(&this->code_,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"} else {",&local_131);
  CodeWriter::operator+=(&this->code_,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  Indent(this);
  std::operator+(&local_178,"__",body_front_local);
  std::operator+(&local_158,&local_178," = Offset()");
  CodeWriter::operator+=(&this->code_,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"}",&local_199);
  CodeWriter::operator+=(&this->code_,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
  CodeWriter::operator+=(&this->code_,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  return;
}

Assistant:

void BuildingOptionalObjects(const std::string &var,
                               const std::string &body_front) {
    code_ += "let __" + var + ": Offset";
    code_ += "if let s = obj." + var + " {";
    Indent();
    code_ += "__" + var + " = " + body_front;
    Outdent();
    code_ += "} else {";
    Indent();
    code_ += "__" + var + " = Offset()";
    Outdent();
    code_ += "}";
    code_ += "";
  }